

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

void __thiscall soul::SourceCodeOperations::SourceCodeOperations(SourceCodeOperations *this)

{
  SourceCodeOperations *this_local;
  
  CodeLocation::CodeLocation(&this->source);
  AST::Allocator::Allocator(&this->allocator);
  pool_ptr<soul::AST::Namespace>::pool_ptr(&this->topLevelNamespace);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::vector(&this->allModules);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::vector(&this->processors);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::vector(&this->graphs);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::vector(&this->namespaces);
  std::function<void_(const_soul::SourceCodeOperations::TextModificationOp_&)>::function
            (&this->applyModification);
  return;
}

Assistant:

SourceCodeOperations::SourceCodeOperations() = default;